

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O0

bool __thiscall
soul::SimpleTokeniser::skipPastMatchingCloseDelimiter
          (SimpleTokeniser *this,TokenType openDelim,TokenType closeDelim)

{
  bool bVar1;
  TokenType local_40;
  TokenType token;
  int local_2c;
  int depth;
  SimpleTokeniser *this_local;
  TokenType closeDelim_local;
  TokenType openDelim_local;
  
  local_2c = 0;
  this_local = (SimpleTokeniser *)closeDelim.text;
  closeDelim_local.text = openDelim.text;
  do {
    while( true ) {
      token.text = "$eof";
      bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matches(&this->super_SOULTokeniser,(TokenType)"$eof");
      if (bVar1) {
        return false;
      }
      local_40 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                 ::skip(&this->super_SOULTokeniser);
      bVar1 = TokenType::operator==(&local_40,&closeDelim_local);
      if (!bVar1) break;
      local_2c = local_2c + 1;
    }
    bVar1 = TokenType::operator==(&local_40,(TokenType *)&this_local);
  } while ((!bVar1) || (local_2c = local_2c + -1, local_2c != 0));
  return true;
}

Assistant:

bool skipPastMatchingCloseDelimiter (TokenType openDelim, TokenType closeDelim)
    {
        int depth = 0;

        for (;;)
        {
            if (matches (Token::eof))
                return false;

            auto token = skip();

            if (token == openDelim)
            {
                ++depth;
            }
            else if (token == closeDelim)
            {
                if (--depth == 0)
                    return true;
            }
        }
    }